

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O1

unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> __thiscall
duckdb::BatchedBufferedData::Scan(BatchedBufferedData *this)

{
  undefined8 *puVar1;
  DataChunk *pDVar2;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var3;
  int iVar4;
  pointer this_00;
  idx_t iVar5;
  long in_RSI;
  bool bVar6;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> chunk;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_30;
  
  local_30._M_head_impl = (DataChunk *)0x0;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0x28));
  _Var3._M_head_impl = local_30._M_head_impl;
  if (iVar4 == 0) {
    puVar1 = *(undefined8 **)(in_RSI + 0xa0);
    if (*(undefined8 **)(in_RSI + 0xc0) == puVar1) {
      ::std::__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x10));
      (this->super_BufferedData)._vptr_BufferedData = (_func_int **)0x0;
    }
    else {
      pDVar2 = (DataChunk *)*puVar1;
      *puVar1 = 0;
      bVar6 = local_30._M_head_impl != (DataChunk *)0x0;
      local_30._M_head_impl = pDVar2;
      if (bVar6) {
        DataChunk::~DataChunk(_Var3._M_head_impl);
        operator_delete(_Var3._M_head_impl);
      }
      ::std::
      deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
      ::pop_front((deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                   *)(in_RSI + 0x90));
      this_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                            *)&local_30);
      iVar5 = DataChunk::GetAllocationSize(this_00);
      LOCK();
      *(long *)(in_RSI + 0xe8) = *(long *)(in_RSI + 0xe8) - iVar5;
      UNLOCK();
      (this->super_BufferedData)._vptr_BufferedData = (_func_int **)local_30._M_head_impl;
      local_30._M_head_impl = (DataChunk *)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x28));
    _Var3._M_head_impl = local_30._M_head_impl;
    if (local_30._M_head_impl != (DataChunk *)0x0) {
      DataChunk::~DataChunk(local_30._M_head_impl);
      operator_delete(_Var3._M_head_impl);
    }
    return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
           (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)this;
  }
  ::std::__throw_system_error(iVar4);
}

Assistant:

unique_ptr<DataChunk> BatchedBufferedData::Scan() {
	unique_ptr<DataChunk> chunk;
	lock_guard<mutex> lock(glock);
	if (!read_queue.empty()) {
		chunk = std::move(read_queue.front());
		read_queue.pop_front();
		auto allocation_size = chunk->GetAllocationSize();
		read_queue_byte_count -= allocation_size;
	} else {
		context.reset();
		D_ASSERT(blocked_sinks.empty());
		D_ASSERT(buffer.empty());
		return nullptr;
	}
	return chunk;
}